

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O2

void cmime_string_list_free(CMimeStringList_T *sl)

{
  ulong uVar1;
  
  if (sl != (CMimeStringList_T *)0x0) {
    for (uVar1 = 0; uVar1 < sl->count; uVar1 = uVar1 + 1) {
      free(sl->node[uVar1]);
    }
    free(sl->node);
    free(sl);
    return;
  }
  __assert_fail("sl",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                ,0x29,"void cmime_string_list_free(CMimeStringList_T *)");
}

Assistant:

void cmime_string_list_free(CMimeStringList_T *sl) {
    size_t i;
    assert(sl);

    for(i = 0; i < sl->count; i++) {
        if (sl->node[i]!=NULL)
            free(sl->node[i]);
    } 
    free(sl->node);
    sl->node = NULL;
    free(sl); 
}